

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int nh_write_socket(nh_stream_t *buf,int socket)

{
  ssize_t sVar1;
  int *piVar2;
  
  sVar1 = write(socket,buf->buf + buf->index,(ulong)(buf->length - buf->index));
  if (0 < (int)sVar1) {
    buf->index = buf->index + (int)sVar1;
  }
  piVar2 = __errno_location();
  return (int)(*piVar2 != 0x20);
}

Assistant:

int nh_write_socket(nh_stream_t *buf, int socket) {
    int bytes = write(
        socket,
        buf->buf + buf->index,
        buf->length - buf->index
    );
    if (bytes > 0) buf->index += bytes;
    return errno == EPIPE ? 0 : 1;
}